

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::LoopLayerParams::MergePartialFromCodedStream
          (LoopLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  short extraout_AX;
  uint32 uVar5;
  int iVar6;
  NeuralNetwork *pNVar7;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  char cVar8;
  uint tag;
  ulong uVar9;
  pair<unsigned_long,_bool> pVar10;
  int local_54;
  int local_50;
  int local_4c;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00228fdd;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00228fdd:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    tag = (uint)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto switchD_00229047_default;
    cVar8 = (char)uVar9;
    switch((uint)(uVar9 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar8 != '\b') break;
      puVar3 = input->buffer_;
      if ((input->buffer_end_ <= puVar3) || ((long)(char)*puVar3 < 0)) {
        pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->maxloopiterations_ = pVar10.first;
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_00229029;
        goto LAB_0022912b;
      }
      this->maxloopiterations_ = (long)(char)*puVar3;
      input->buffer_ = puVar3 + 1;
      goto LAB_00229029;
    case 2:
      MergePartialFromCodedStream();
      if (extraout_AX == 0) break;
      iVar6 = local_4c;
      if (extraout_AX == 1) goto LAB_00229029;
      goto LAB_0022902b;
    case 3:
      if (cVar8 == '\x1a') {
        if (this->conditionnetwork_ == (NeuralNetwork *)0x0) {
          pNVar7 = (NeuralNetwork *)operator_new(0x58);
          NeuralNetwork::NeuralNetwork(pNVar7);
          this->conditionnetwork_ = pNVar7;
        }
        MergePartialFromCodedStream();
        iVar6 = local_50;
        uVar9 = extraout_RAX_00;
joined_r0x002290b7:
        if ((uVar9 & 1) == 0) goto LAB_00229029;
        goto LAB_0022902b;
      }
      break;
    case 4:
      if (cVar8 == '\"') {
        if (this->bodynetwork_ == (NeuralNetwork *)0x0) {
          pNVar7 = (NeuralNetwork *)operator_new(0x58);
          NeuralNetwork::NeuralNetwork(pNVar7);
          this->bodynetwork_ = pNVar7;
        }
        MergePartialFromCodedStream();
        iVar6 = local_54;
        uVar9 = extraout_RAX;
        goto joined_r0x002290b7;
      }
    }
switchD_00229047_default:
    iVar6 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
      if (bVar4) {
LAB_00229029:
        iVar6 = 0;
      }
      else {
LAB_0022912b:
        iVar6 = 6;
      }
    }
LAB_0022902b:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool LoopLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LoopLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 maxLoopIterations = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &maxloopiterations_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string conditionVar = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_conditionvar()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->conditionvar().data(), this->conditionvar().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.LoopLayerParams.conditionVar"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetwork conditionNetwork = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_conditionnetwork()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetwork bodyNetwork = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bodynetwork()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LoopLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LoopLayerParams)
  return false;
#undef DO_
}